

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

Result<fs::path> * wallet::GetWalletPath(Result<fs::path> *__return_storage_ptr__,string *name)

{
  char cVar1;
  bool bVar2;
  path *this;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_R8;
  long in_FS_OFFSET;
  path wallet_path;
  string in_stack_fffffffffffffea8;
  string local_130;
  bilingual_str local_110;
  path local_d0;
  path local_a8;
  path local_80;
  path local_58;
  long local_30;
  
  this = (path *)&stack0xfffffffffffffea8;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetWalletDir();
  fs::PathFromString((path *)&local_a8,name);
  fsbridge::AbsPathJoin((path *)&local_58,(path *)&local_80,(path *)&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_80);
  cVar1 = std::filesystem::symlink_status(&local_58);
  if (cVar1 == '\x01') {
    fs::PathFromString((path *)&local_a8,name);
    fs::path::filename((path *)&local_80,(path *)&local_a8);
    fs::PathFromString((path *)&local_d0,name);
    bVar2 = std::filesystem::__cxx11::operator==(&local_80,&local_d0);
    std::filesystem::__cxx11::path::~path(&local_d0);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::filesystem::__cxx11::path::~path(&local_a8);
    if (!bVar2) goto LAB_0099b955;
  }
  else if ((cVar1 != '\x02') && (cVar1 != -1)) {
    if (cVar1 == '\x03') {
      bVar2 = std::filesystem::is_directory((path *)&local_58);
      if (bVar2) goto LAB_0099b8ba;
    }
LAB_0099b955:
    GetWalletDir();
    std::filesystem::__cxx11::path::string(&local_a8._M_pathname,&local_80);
    local_d0._M_pathname._M_string_length._0_2_ = 0x2622;
    local_d0._M_pathname._M_dataplus._M_p = (pointer)&local_a8;
    tinyformat::
    format<std::__cxx11::string,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              (&local_130,
               (tinyformat *)
               "Invalid -wallet path \'%s\'. -wallet path should point to a directory where wallet.dat and database/log.?????????? files can be stored, a location where such a directory could be created, or (for backwards compatibility) the name of an existing data file in -walletdir (%s)"
               ,(char *)name,&local_d0._M_pathname,in_R8);
    Untranslated(&local_110,in_stack_fffffffffffffea8);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,fs::path>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,fs::path> *)__return_storage_ptr__,&local_110);
    bilingual_str::~bilingual_str(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_a8);
    this = &local_80;
    goto LAB_0099b9e4;
  }
LAB_0099b8ba:
  std::filesystem::__cxx11::path::path((path *)&stack0xfffffffffffffea8,(path *)&local_58);
  std::__detail::__variant::_Variant_storage<false,bilingual_str,fs::path>::
  _Variant_storage<1ul,fs::path>
            ((_Variant_storage<false,bilingual_str,fs::path> *)__return_storage_ptr__,
             &stack0xfffffffffffffea8);
LAB_0099b9e4:
  std::filesystem::__cxx11::path::~path(this);
  std::filesystem::__cxx11::path::~path((path *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<fs::path> GetWalletPath(const std::string& name)
{
    // Do some checking on wallet path. It should be either a:
    //
    // 1. Path where a directory can be created.
    // 2. Path to an existing directory.
    // 3. Path to a symlink to a directory.
    // 4. For backwards compatibility, the name of a data file in -walletdir.
    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(name));
    fs::file_type path_type = fs::symlink_status(wallet_path).type();
    if (!(path_type == fs::file_type::not_found || path_type == fs::file_type::directory ||
          (path_type == fs::file_type::symlink && fs::is_directory(wallet_path)) ||
          (path_type == fs::file_type::regular && fs::PathFromString(name).filename() == fs::PathFromString(name)))) {
        return util::Error{Untranslated(strprintf(
              "Invalid -wallet path '%s'. -wallet path should point to a directory where wallet.dat and "
              "database/log.?????????? files can be stored, a location where such a directory could be created, "
              "or (for backwards compatibility) the name of an existing data file in -walletdir (%s)",
              name, fs::quoted(fs::PathToString(GetWalletDir()))))};
    }
    return wallet_path;
}